

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::ArithMetaMethod(SQVM *this,SQInteger op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  bool bVar2;
  int iVar3;
  SQChar *pSVar4;
  SQChar *pSVar5;
  SQMetaMethod mm;
  undefined8 uVar6;
  SQObjectPtr closure;
  SQObject local_48;
  
  uVar6 = 0;
  if (op < 0x2d) {
    if (op == 0x25) {
      uVar6 = 5;
    }
    else if (op == 0x2a) {
      uVar6 = 2;
    }
  }
  else if (op == 0x2f) {
    uVar6 = 3;
  }
  else if (op == 0x2d) {
    uVar6 = 1;
  }
  if ((((o1->super_SQObject)._type & 0x2000000) != 0) &&
     (pSVar1 = (o1->super_SQObject)._unVal.pTable,
     (pSVar1->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    local_48._unVal.pTable = (SQTable *)0x0;
    local_48._type = OT_NULL;
    local_48._flags = '\0';
    local_48._5_3_ = 0;
    iVar3 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar1,this,uVar6);
    if ((char)iVar3 != '\0') {
      Push(this,o1);
      Push(this,o2);
      bVar2 = CallMetaMethod(this,(SQObjectPtr *)&local_48,mm,2,dest);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
      return bVar2;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
  }
  pSVar4 = GetTypeName(o1);
  pSVar5 = GetTypeName(o2);
  Raise_Error(this,"arith op %c on between \'%s\' and \'%s\'",(ulong)(uint)(int)(char)op,pSVar4,
              pSVar5);
  return false;
}

Assistant:

bool SQVM::ArithMetaMethod(SQInteger op,const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &dest)
{
    SQMetaMethod mm;
    switch(op){
        case _SC('+'): mm=MT_ADD; break;
        case _SC('-'): mm=MT_SUB; break;
        case _SC('/'): mm=MT_DIV; break;
        case _SC('*'): mm=MT_MUL; break;
        case _SC('%'): mm=MT_MODULO; break;
        default: mm = MT_ADD; assert(0); break; //shutup compiler
    }
    if(is_delegable(o1) && _delegable(o1)->_delegate) {

        SQObjectPtr closure;
        if(_delegable(o1)->GetMetaMethod(this, mm, closure)) {
            Push(o1);Push(o2);
            return CallMetaMethod(closure,mm,2,dest);
        }
    }
    Raise_Error(_SC("arith op %c on between '%s' and '%s'"),(char)op,GetTypeName(o1),GetTypeName(o2));
    return false;
}